

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

bool __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::operator==
          (ChannelGroupManifest *this,ChannelGroupManifest *other)

{
  bool bVar1;
  __type _Var2;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *in_stack_ffffffffffffffd8;
  bool local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  
  local_11 = false;
  if (*(int *)&in_RDI[2]._M_string_length == *(int *)(in_RSI + 0x48)) {
    __rhs = in_RDI;
    bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)unaff_retaddr,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_RDI);
    local_11 = false;
    if (bVar1) {
      _Var2 = std::operator==(unaff_retaddr,__rhs);
      local_11 = false;
      if (_Var2) {
        bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)unaff_retaddr,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)__rhs);
        local_11 = false;
        if (bVar1) {
          local_11 = std::operator==((map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                      *)in_RDI,in_stack_ffffffffffffffd8);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool
IDManifest::ChannelGroupManifest::operator== (
    const IDManifest::ChannelGroupManifest& other) const
{
    return (
        _lifeTime == other._lifeTime && _components == other._components &&
        _hashScheme == other._hashScheme && _components == other._components &&
        _table == other._table);
}